

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::initPrograms
          (SamplerTest *this,SourceCollections *sourceCollections)

{
  VkImageViewType VVar1;
  bool bVar2;
  CompressedTexFormat format;
  TextureChannelClass TVar3;
  TextureFormat TVar4;
  ostream *poVar5;
  ProgramSources *pPVar6;
  char *pcVar7;
  char *pcVar8;
  Vec4 lookupBias;
  Vec4 lookupScale;
  ostringstream fragmentSrc;
  ostringstream vertexSrc;
  allocator<char> local_4f9;
  string local_4f8;
  string local_4d8;
  Vector<float,_4> local_4b8;
  Vector<float,_4> local_4a8;
  undefined1 local_498 [376];
  ostringstream local_320 [376];
  ostringstream local_1a8 [376];
  ChannelType channelType;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  bVar2 = ::vk::isCompressedFormat(this->m_imageFormat);
  if (bVar2) {
    format = ::vk::mapVkCompressedFormat(this->m_imageFormat);
    TVar4 = tcu::getUncompressedFormat(format);
    channelType = TVar4.type;
  }
  else {
    TVar4 = ::vk::mapVkFormat(this->m_imageFormat);
    channelType = TVar4.type;
  }
  tcu::Vector<float,_4>::Vector(&local_4a8);
  tcu::Vector<float,_4>::Vector(&local_4b8);
  getLookupScaleBias(this->m_imageFormat,&local_4a8,&local_4b8);
  if ((ulong)this->m_imageViewType < 7) {
    pcVar8 = &DAT_00984444 + *(int *)(&DAT_00984444 + (ulong)this->m_imageViewType * 4);
  }
  else {
    pcVar8 = (char *)0x0;
  }
  poVar5 = std::operator<<((ostream *)local_1a8,"#version 440\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) in vec4 position;\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 1) in vec4 texCoords;\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) out highp vec4 vtxTexCoords;\n");
  poVar5 = std::operator<<(poVar5,"out gl_PerVertex {\n");
  poVar5 = std::operator<<(poVar5,"\tvec4 gl_Position;\n");
  poVar5 = std::operator<<(poVar5,"};\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"\tgl_Position = position;\n");
  poVar5 = std::operator<<(poVar5,"\tvtxTexCoords = texCoords;\n");
  std::operator<<(poVar5,"}\n");
  poVar5 = std::operator<<((ostream *)local_320,"#version 440\n");
  poVar5 = std::operator<<(poVar5,"layout(set = 0, binding = 0) uniform highp ");
  VVar1 = this->m_imageViewType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  TVar3 = tcu::getTextureChannelClass(channelType);
  if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar7 = "u";
  }
  else {
    TVar3 = tcu::getTextureChannelClass(channelType);
    if (TVar3 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_00530a29;
    pcVar7 = "i";
  }
  std::operator<<((ostream *)local_498,pcVar7);
LAB_00530a29:
  if (VVar1 < VK_IMAGE_VIEW_TYPE_LAST) {
    std::operator<<((ostream *)local_498,&DAT_00984460 + *(int *)(&DAT_00984460 + (ulong)VVar1 * 4))
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  poVar5 = std::operator<<(poVar5,(string *)&local_4f8);
  poVar5 = std::operator<<(poVar5," texSampler;\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) in highp vec4 vtxTexCoords;\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) out highp vec4 fragColor;\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  std::operator<<(poVar5,"\tfragColor = ");
  std::__cxx11::string::~string((string *)&local_4f8);
  if (this->m_samplerLod <= 0.0) {
    poVar5 = std::operator<<((ostream *)local_320,"texture(texSampler, vtxTexCoords.");
    poVar5 = std::operator<<(poVar5,pcVar8);
    poVar5 = std::operator<<(poVar5,")");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
  }
  else {
    poVar5 = std::operator<<((ostream *)local_320,"textureLod(texSampler, vtxTexCoords.");
    poVar5 = std::operator<<(poVar5,pcVar8);
    poVar5 = std::operator<<(poVar5,", ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_samplerLod);
    std::operator<<(poVar5,")");
  }
  poVar5 = std::operator<<((ostream *)local_320," * vec4");
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 0x100;
  poVar5 = tcu::operator<<(poVar5,&local_4a8);
  poVar5 = std::operator<<(poVar5," + vec4");
  poVar5 = tcu::operator<<(poVar5,&local_4b8);
  poVar5 = std::operator<<(poVar5,";\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"tex_vert",&local_4f9);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_4f8);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_498,&local_4d8);
  glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_498);
  std::__cxx11::string::~string((string *)(local_498 + 8));
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"tex_frag",&local_4f9);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_4f8);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_498,&local_4d8);
  glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_498);
  std::__cxx11::string::~string((string *)(local_498 + 8));
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void SamplerTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream				vertexSrc;
	std::ostringstream				fragmentSrc;
	const char*						texCoordSwizzle	= DE_NULL;
	tcu::TextureFormat				format			= (isCompressedFormat(m_imageFormat)) ? tcu::getUncompressedFormat(mapVkCompressedFormat(m_imageFormat))
																						  : mapVkFormat(m_imageFormat);
	tcu::Vec4						lookupScale;
	tcu::Vec4						lookupBias;

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	switch (m_imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
			texCoordSwizzle = "x";
			break;
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_2D:
			texCoordSwizzle = "xy";
			break;
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_3D:
		case VK_IMAGE_VIEW_TYPE_CUBE:
			texCoordSwizzle = "xyz";
			break;
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			texCoordSwizzle = "xyzw";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	vertexSrc << "#version 440\n"
			  << "layout(location = 0) in vec4 position;\n"
			  << "layout(location = 1) in vec4 texCoords;\n"
			  << "layout(location = 0) out highp vec4 vtxTexCoords;\n"
			  << "out gl_PerVertex {\n"
			  << "	vec4 gl_Position;\n"
			  << "};\n"
			  << "void main (void)\n"
			  << "{\n"
			  << "	gl_Position = position;\n"
			  << "	vtxTexCoords = texCoords;\n"
			  << "}\n";

	fragmentSrc << "#version 440\n"
				<< "layout(set = 0, binding = 0) uniform highp " << getGlslSamplerType(format, m_imageViewType) << " texSampler;\n"
				<< "layout(location = 0) in highp vec4 vtxTexCoords;\n"
				<< "layout(location = 0) out highp vec4 fragColor;\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "	fragColor = ";

	if (m_samplerLod > 0.0f)
		fragmentSrc << "textureLod(texSampler, vtxTexCoords." << texCoordSwizzle << ", " << std::fixed <<  m_samplerLod << ")";
	else
		fragmentSrc << "texture(texSampler, vtxTexCoords." << texCoordSwizzle << ")" << std::fixed;

	fragmentSrc << " * vec4" << std::scientific << lookupScale << " + vec4" << lookupBias << ";\n"
				<< "}\n";

	sourceCollections.glslSources.add("tex_vert") << glu::VertexSource(vertexSrc.str());
	sourceCollections.glslSources.add("tex_frag") << glu::FragmentSource(fragmentSrc.str());
}